

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::Clara::addOptName(Arg *arg,string *optName)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  logic_error *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  value_type *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator *__lhs;
  string local_158 [32];
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  string local_f0 [39];
  undefined1 local_c9;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    __lhs = &local_31;
    __rhs = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"--",__lhs);
    bVar1 = Detail::startsWith((string *)
                               CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                               in_stack_fffffffffffffe60);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    if ((bVar1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"-",&local_111);
      bVar2 = Detail::startsWith((string *)CONCAT17(bVar1,in_stack_fffffffffffffe68),
                                 in_stack_fffffffffffffe60);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      if (!bVar2) {
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+((char *)__lhs,__rhs);
        std::operator+(in_stack_fffffffffffffe38,(char *)plVar4);
        std::logic_error::logic_error(plVar4,local_158);
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::substr((ulong)local_138,(ulong)local_10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      std::__cxx11::string::~string(local_138);
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_c9 = 1;
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+((char *)__lhs,__rhs);
        std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
        std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
        std::logic_error::logic_error(plVar4,local_68);
        local_c9 = 0;
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::substr((ulong)local_f0,(ulong)local_10);
      std::__cxx11::string::operator=((string *)(local_8 + 0x80),local_f0);
      std::__cxx11::string::~string(local_f0);
    }
  }
  return;
}

Assistant:

void addOptName( Arg& arg, std::string const& optName )
        {
            if( optName.empty() )
                return;
            if( Detail::startsWith( optName, "--" ) ) {
                if( !arg.longName.empty() )
                    throw std::logic_error( "Only one long opt may be specified. '"
                        + arg.longName
                        + "' already specified, now attempting to add '"
                        + optName + "'" );
                arg.longName = optName.substr( 2 );
            }
            else if( Detail::startsWith( optName, "-" ) )
                arg.shortNames.push_back( optName.substr( 1 ) );
            else
                throw std::logic_error( "option must begin with - or --. Option was: '" + optName + "'" );
        }